

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.hh
# Opt level: O0

void __thiscall UnitTest::runAll(UnitTest *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference ppBVar4;
  BaseCase *test;
  iterator __end1;
  iterator __begin1;
  vector<BaseCase_*,_std::allocator<BaseCase_*>_> *__range1;
  UnitTest *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,">>> running ");
  sVar3 = std::vector<BaseCase_*,_std::allocator<BaseCase_*>_>::size(&this->test_cases_);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," tests...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<BaseCase_*,_std::allocator<BaseCase_*>_>::begin(&this->test_cases_);
  test = (BaseCase *)std::vector<BaseCase_*,_std::allocator<BaseCase_*>_>::end(&this->test_cases_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BaseCase_**,_std::vector<BaseCase_*,_std::allocator<BaseCase_*>_>_>
                                *)&test);
    if (!bVar1) break;
    ppBVar4 = __gnu_cxx::
              __normal_iterator<BaseCase_**,_std::vector<BaseCase_*,_std::allocator<BaseCase_*>_>_>
              ::operator*(&__end1);
    this->current_case_ = *ppBVar4;
    (**this->current_case_->_vptr_BaseCase)();
    __gnu_cxx::__normal_iterator<BaseCase_**,_std::vector<BaseCase_*,_std::allocator<BaseCase_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void runAll()
    {
        std::cout << ">>> running " << test_cases_.size() << " tests..." << std::endl;
        for(BaseCase* test : test_cases_)
        {
            current_case_ = test;
            current_case_->run();
        }
    }